

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Opnd * __thiscall
GlobOpt::CopyProp(GlobOpt *this,Opnd *opnd,Instr *instr,Value *val,IndirOpnd *parentIndirOpnd)

{
  OpCode OVar1;
  int iVar2;
  Opnd *this_00;
  code *pcVar3;
  GlobOpt *pGVar4;
  OpndKind OVar5;
  bool bVar6;
  OpndKind OVar7;
  uint uVar8;
  uint uVar9;
  JITTimeFunctionBody *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  IndirOpnd *pIVar12;
  Sym *pSVar13;
  Int64ConstOpnd *this_01;
  AddrOpnd *this_02;
  StackSym *pSVar14;
  int64 iVar15;
  Opnd *pOVar16;
  RegOpnd *pRVar17;
  undefined4 *puVar18;
  SymOpnd *pSVar19;
  StackSym *pSVar20;
  IRType type;
  uint uVar21;
  ulong value;
  int i;
  long lVar22;
  Instr *pIVar23;
  anon_union_2_4_ea848c7b_for_ValueType_13 aaStack_78 [2];
  undefined4 uStack_74;
  int64 int64ConstantValue;
  Opnd *local_68;
  Sym *local_58;
  IndirOpnd *local_50;
  Instr *local_48;
  uint local_3c;
  GlobOpt *pGStack_38;
  int32 intConstantValue;
  
  pGStack_38 = this;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    if (((instr->m_src1 != opnd) && (instr->m_src2 != opnd)) &&
       ((instr->m_dst != opnd || (OVar5 = IR::Opnd::GetKind(opnd), OVar5 != OpndKindIndir))))
    goto LAB_00450115;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_00450115:
    AssertCount = AssertCount + 1;
    local_50 = parentIndirOpnd;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xe8d,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar6) goto LAB_00450f12;
    *puVar18 = 0;
    parentIndirOpnd = local_50;
  }
  if (pGStack_38->prePassLoop != (Loop *)0x0) {
    return opnd;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == CheckFixedFld) {
    return opnd;
  }
  if (OVar1 == CheckPropertyGuardAndLoadType) {
    return opnd;
  }
  if ((OVar1 == ExtendArg_A) && (instr->m_src2 == opnd)) {
    return opnd;
  }
  if ((((((ushort)(OVar1 - Simd128_IntsToI4) < 0x14 ||
          (ushort)(OVar1 - Simd128_BitSelect_I4) < 0x123) && (instr->m_src1 != (Opnd *)0x0)) &&
       (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 == OpndKindReg)) &&
      ((instr->m_src2 == (Opnd *)0x0 &&
       (pSVar20 = IR::Opnd::GetStackSym(instr->m_src1), pSVar20 != (StackSym *)0x0)))) &&
     ((((pSVar20->field_5).m_instrDef != (Instr *)0x0 & pSVar20->field_0x18) == 1 &&
      (((pSVar20->field_5).m_instrDef)->m_opcode == ExtendArg_A)))) {
    return opnd;
  }
  pIVar12 = (IndirOpnd *)val->valueInfo;
  bVar6 = Func::HasFinally(pGStack_38->func);
  if (((bVar6) && (instr->m_opcode == ArgOut_A_Inline)) &&
     ((pIVar12->m_baseOpnd != (RegOpnd *)0x0 && (*(SymID *)&pIVar12->m_baseOpnd->m_sym == 0)))) {
    return opnd;
  }
  bVar6 = ValueInfo::TryGetIntConstantValue((ValueInfo *)pIVar12,(int32 *)&local_3c,false);
  pGVar4 = pGStack_38;
  local_48 = instr;
  if (!bVar6) {
    local_50 = pIVar12;
    bVar6 = ValueInfo::TryGetIntConstantValue
                      ((ValueInfo *)pIVar12,(int64 *)&aaStack_78[0].bits,false);
    pGVar4 = pGStack_38;
    if (!bVar6) {
      OVar5 = IR::Opnd::GetKind(opnd);
      OVar7 = IR::Opnd::GetKind(opnd);
      if (OVar5 == OpndKindReg) {
        pSVar19 = (SymOpnd *)opnd;
        if (OVar7 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar18 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar6) goto LAB_00450f12;
          *puVar18 = 0;
        }
      }
      else {
        if (OVar7 != OpndKindSym) {
          return opnd;
        }
        pSVar19 = IR::Opnd::AsSymOpnd(opnd);
      }
      pGVar4 = pGStack_38;
      local_58 = pSVar19->m_sym;
      if (local_58 == (Sym *)0x0) {
        return opnd;
      }
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,CopyPropPhase,uVar8,uVar9);
      pSVar13 = local_58;
      if (!bVar6) {
        pSVar20 = GlobOptBlockData::GetCopyPropSym
                            (&pGStack_38->currentBlock->globOptData,local_58,val);
        pIVar23 = local_48;
        if (pSVar20 != (StackSym *)0x0) {
          if ((pSVar13->m_kind == SymKindStack) &&
             (iVar2 = TySize[pSVar20->m_type], pSVar14 = Sym::AsStackSym(pSVar13),
             iVar2 != TySize[pSVar14->m_type])) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar18 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xf8d,
                               "(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize())"
                               ,
                               "!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize()"
                              );
            if (!bVar6) goto LAB_00450f12;
            *puVar18 = 0;
          }
          pOVar16 = CopyPropReplaceOpnd(pGStack_38,local_48,opnd,pSVar20,parentIndirOpnd);
          return pOVar16;
        }
        if ((((local_50->m_baseOpnd != (RegOpnd *)0x0) && (local_48->m_opcode == Ld_A)) &&
            (OVar5 = IR::Opnd::GetKind(local_48->m_dst), OVar5 == OpndKindReg)) &&
           (pSVar20 = (StackSym *)local_50->m_baseOpnd,
           pRVar17 = IR::Opnd::AsRegOpnd(pIVar23->m_dst), pSVar20 == pRVar17->m_sym)) {
          return opnd;
        }
      }
      SetSymStoreDirect(pGStack_38,(ValueInfo *)local_50,pSVar13);
      return opnd;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,ConstPropPhase,uVar8,uVar9);
    pGVar4 = pGStack_38;
    if (bVar6) {
      return opnd;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015aabd0,Int64ConstPropPhase,uVar8,uVar9);
    if (!bVar6) {
      return opnd;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    bVar6 = JITTimeFunctionBody::IsWasmFunction(pJVar10);
    if (bVar6) {
LAB_004506b7:
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
      bVar6 = JITTimeFunctionBody::IsWasmFunction(pJVar10);
      if (!bVar6) {
        return opnd;
      }
      bVar6 = IRType_IsInt64(opnd->m_type);
      pIVar23 = local_48;
      if (!bVar6) {
        return opnd;
      }
      this_01 = IR::Int64ConstOpnd::New
                          (CONCAT44(uStack_74,CONCAT22(aaStack_78[1],aaStack_78[0].bits)),
                           opnd->m_type,local_48->m_func);
      pGVar4 = pGStack_38;
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
      if (bVar6) {
        Output::Print(L"TRACE ");
        if (pGStack_38->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                        (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        IR::Opnd::Dump(opnd);
        Output::Print(L" : ");
        pIVar23 = local_48;
        iVar15 = IR::Opnd::GetImmediateValue(&this_01->super_Opnd,local_48->m_func);
        Output::Print(L"Constant prop %lld (value:%lld)\n",iVar15,
                      CONCAT44(uStack_74,CONCAT22(aaStack_78[1],aaStack_78[0].bits)));
        Output::Flush();
      }
      CaptureByteCodeSymUses(pGStack_38,pIVar23);
      pOVar16 = IR::Instr::ReplaceSrc(pIVar23,opnd,&this_01->super_Opnd);
      return pOVar16;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xf69,"(this->func->GetJITFunctionBody()->IsWasmFunction())",
                       "this->func->GetJITFunctionBody()->IsWasmFunction()");
    if (bVar6) {
      *puVar18 = 0;
      goto LAB_004506b7;
    }
    goto LAB_00450f12;
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,ConstPropPhase,uVar8,uVar9);
  pIVar23 = local_48;
  if (bVar6) {
    return opnd;
  }
  OVar1 = local_48->m_opcode;
  if ((((OVar1 == StElemI_A) || (OVar1 == StElemC)) || (OVar1 == StElemI_A_Strict)) &&
     (local_48->m_src1 == opnd)) {
    pIVar12 = IR::Opnd::AsIndirOpnd(local_48->m_dst);
    aaStack_78[0] = (pIVar12->m_baseOpnd->super_Opnd).m_valueType.field_0;
    bVar6 = ValueType::IsLikelyNativeArray((ValueType *)&aaStack_78[0].field_0);
    if (bVar6) {
      return opnd;
    }
  }
  if ((pIVar23->m_src1 != opnd) && (pIVar23->m_src2 != opnd)) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pIVar23->m_func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pIVar23->m_func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,IndirCopyPropPhase,uVar8,uVar9);
    if (bVar6) {
      return opnd;
    }
    uStack_74 = *(undefined4 *)((long)&pIVar23->m_src1 + 4);
    int64ConstantValue._0_4_ = *(undefined4 *)&pIVar23->m_src2;
    int64ConstantValue._4_4_ = *(undefined4 *)((long)&pIVar23->m_src2 + 4);
    aaStack_78[0].bits = (Type)*(undefined4 *)&pIVar23->m_src1;
    aaStack_78[1] = SUB42((uint)*(undefined4 *)&pIVar23->m_src1 >> 0x10,0);
    local_68 = pIVar23->m_dst;
    pSVar13 = (Sym *)__tls_get_addr(&PTR_01548f08);
    lVar22 = 0;
    local_58 = pSVar13;
    do {
      pIVar12 = *(IndirOpnd **)(aaStack_78 + lVar22 * 4);
      if ((pIVar12 != (IndirOpnd *)0x0) &&
         (OVar5 = IR::Opnd::GetKind(&pIVar12->super_Opnd), OVar5 == OpndKindIndir)) {
        OVar5 = IR::Opnd::GetKind(&pIVar12->super_Opnd);
        if (OVar5 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)&pSVar13->_vptr_Sym = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar6) goto LAB_00450f12;
          *(undefined4 *)&pSVar13->_vptr_Sym = 0;
        }
        if (((long)(int)local_3c + (long)pIVar12->m_offset < 0x80000000) &&
           (pIVar12->m_indexOpnd == (RegOpnd *)opnd)) {
          if (pIVar12->m_scale != '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pSVar13->_vptr_Sym = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xeed,"(indir->GetScale() == 0)","indir->GetScale() == 0");
            if (!bVar6) goto LAB_00450f12;
            *(undefined4 *)&pSVar13->_vptr_Sym = 0;
          }
          pGVar4 = pGStack_38;
          pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
          uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
          local_50 = (IndirOpnd *)CONCAT44(local_50._4_4_,uVar8);
          pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
          uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,(uint)local_50,uVar8);
          if (bVar6) {
            Output::Print(L"TRACE ");
            if (pGStack_38->prePassLoop != (Loop *)0x0) {
              Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                            (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            IR::Opnd::Dump(opnd);
            Output::Print(L" : ");
            Output::Print(L"Constant prop indir index into offset (value: %d)\n",(ulong)local_3c);
            Output::Flush();
          }
          CaptureByteCodeSymUses(pGStack_38,local_48);
          pIVar12->m_offset = pIVar12->m_offset + local_3c;
          (pIVar12->super_Opnd).field_0xe = 0;
          IR::IndirOpnd::SetIndexOpnd(pIVar12,(RegOpnd *)0x0);
          pSVar13 = local_58;
        }
      }
      lVar22 = lVar22 + 1;
      if (lVar22 == 3) {
        return opnd;
      }
    } while( true );
  }
  type = opnd->m_type;
  if (type == TyInt32) {
LAB_00450ba8:
    value = (ulong)local_3c;
    if (type != TyUint32) {
      value = (long)(int)local_3c;
    }
    this_02 = (AddrOpnd *)
              IR::IntConstOpnd::New
                        (value,(type == TyUint32) * '\x04' + TyInt32,pIVar23->m_func,false);
    pGVar4 = pGStack_38;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
    pIVar23 = local_48;
    if (bVar6) {
      Output::Print(L"TRACE ");
      if (pGStack_38->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                      (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(opnd);
      Output::Print(L" : ");
      pIVar23 = local_48;
      iVar15 = IR::Opnd::GetImmediateValue((Opnd *)this_02,local_48->m_func);
      Output::Print(L"Constant prop %d (value:%d)\n",iVar15,(ulong)local_3c);
LAB_00450cb2:
      Output::Flush();
    }
  }
  else {
    if (type != TyVar) {
      bVar6 = IRType_IsInt64(type);
      type = opnd->m_type;
      if ((!bVar6) && (bVar6 = type != TyUint32, type = TyUint32, bVar6)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar18 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xf09,"(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32())",
                           "opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32()");
        if (!bVar6) goto LAB_00450f12;
        *puVar18 = 0;
        type = opnd->m_type;
        pIVar23 = local_48;
      }
      goto LAB_00450ba8;
    }
    this_02 = IR::AddrOpnd::New((Var)((ulong)local_3c | 0x1000000000000),AddrOpndKindConstantVar,
                                pIVar23->m_func,false,(Var)0x0);
    pGVar4 = pGStack_38;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar8,uVar9);
    pIVar23 = local_48;
    if (bVar6) {
      Output::Print(L"TRACE ");
      if (pGStack_38->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                      (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(opnd);
      Output::Print(L" : ");
      Output::Print(L"Constant prop %d (value:%d)\n",this_02->m_address,(ulong)local_3c);
      pIVar23 = local_48;
      goto LAB_00450cb2;
    }
  }
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,FieldCopyPropPhase);
  if (bVar6) {
    IR::Instr::DumpFieldCopyPropTestTrace
              (pIVar23,SUB41((*(uint *)&pGStack_38->field_0xf4 & 0x20) >> 5,0));
  }
  CaptureByteCodeSymUses(pGStack_38,pIVar23);
  pOVar16 = IR::Instr::ReplaceSrc(pIVar23,opnd,&this_02->super_Opnd);
  OVar1 = pIVar23->m_opcode;
  if (OVar1 < LdRootFldForTypeOf) {
    uVar21 = OVar1 - 0x59;
    if (uVar21 < 0x34) {
      if ((0x81800002aa020U >> ((ulong)uVar21 & 0x3f) & 1) != 0) goto LAB_00450d38;
      if ((ulong)uVar21 == 0) goto LAB_00450e50;
    }
    if (OVar1 == TypeofElem) {
      pIVar23->m_opcode = Typeof;
      return pOVar16;
    }
    if (OVar1 != Ld_A) {
      return pOVar16;
    }
  }
  else {
    uVar21 = OVar1 - 0x1ed;
    if (uVar21 < 0xc) {
      if ((0x23U >> (uVar21 & 0x1f) & 1) != 0) {
LAB_00450e50:
        OVar5 = IR::Opnd::GetKind(pIVar23->m_dst);
        if (OVar5 == OpndKindReg) {
          pRVar17 = IR::Opnd::AsRegOpnd(pIVar23->m_dst);
          if ((pRVar17->m_sym->field_0x18 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar18 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xf48,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                               "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
            if (!bVar6) {
LAB_00450f12:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar18 = 0;
            pIVar23 = local_48;
          }
          pSVar19 = (SymOpnd *)IR::Opnd::AsRegOpnd(pIVar23->m_dst);
        }
        else {
          pSVar19 = IR::Opnd::AsSymOpnd(pIVar23->m_dst);
        }
        pSVar20 = Sym::AsStackSym((Sym *)pSVar19->m_sym);
        goto LAB_00450efc;
      }
      if ((0x300U >> (uVar21 & 0x1f) & 1) != 0) goto LAB_00450d38;
      if (uVar21 == 0xb) {
        if (pIVar23->m_src2 != pOVar16) {
          return pOVar16;
        }
        pIVar23->m_opcode = StSlot;
        IR::Instr::FreeSrc2(pIVar23);
        return (Opnd *)0x0;
      }
    }
    if ((OVar1 != ScopedLdFldForTypeOf) && (OVar1 != LdRootFldForTypeOf)) {
      return pOVar16;
    }
LAB_00450d38:
    pIVar23->m_opcode = Ld_A;
  }
  this_00 = pIVar23->m_dst;
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar5 != OpndKindReg) {
    return pOVar16;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(this_00);
  if ((pRVar17->m_sym->field_0x18 & 1) == 0) {
    return pOVar16;
  }
  if ((pRVar17->m_sym->field_5).m_instrDef == (Instr *)0x0) {
    return pOVar16;
  }
  pRVar17 = IR::Opnd::AsRegOpnd(this_00);
  pSVar20 = pRVar17->m_sym;
LAB_00450efc:
  StackSym::SetIsIntConst(pSVar20,(long)(int)local_3c);
  return pOVar16;
}

Assistant:

IR::Opnd *
GlobOpt::CopyProp(IR::Opnd *opnd, IR::Instr *instr, Value *val, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    if (this->IsLoopPrePass())
    {
        // Transformations are not legal in prepass...
        return opnd;
    }

    if (instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType)
    {
        // Don't copy prop into CheckFixedFld or CheckPropertyGuardAndLoadType
        return opnd;
    }

    // Don't copy-prop link operands of ExtendedArgs
    if (instr->m_opcode == Js::OpCode::ExtendArg_A && opnd == instr->GetSrc2())
    {
        return opnd;
    }

    // Don't copy-prop operand of SIMD instr with ExtendedArg operands. Each instr should have its exclusive EA sequence.
    if (
            Js::IsSimd128Opcode(instr->m_opcode) &&
            instr->GetSrc1() != nullptr &&
            instr->GetSrc1()->IsRegOpnd() &&
            instr->GetSrc2() == nullptr
       )
    {
        StackSym *sym = instr->GetSrc1()->GetStackSym();
        if (sym && sym->IsSingleDef() && sym->GetInstrDef()->m_opcode == Js::OpCode::ExtendArg_A)
        {
                return opnd;
        }
    }

    ValueInfo *valueInfo = val->GetValueInfo();

    if (this->func->HasFinally())
    {
        // s0 = undefined was added on functions with early exit in try-finally functions, that can get copy-proped and case incorrect results
        if (instr->m_opcode == Js::OpCode::ArgOut_A_Inline && valueInfo->GetSymStore() &&
            valueInfo->GetSymStore()->m_id == 0)
        {
            // We don't want to copy-prop s0 (return symbol) into inlinee code
            return opnd;
        }
    }

    // Constant prop?
    int32 intConstantValue;
    int64 int64ConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func))
        {
            return opnd;
        }

        if ((
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC
            ) && instr->GetSrc1() == opnd)
        {
            // Disabling prop to src of native array store, because we were losing the chance to type specialize.
            // Is it possible to type specialize this src if we allow constants, etc., to be prop'd here?
            if (instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray())
            {
                return opnd;
            }
        }

        if(opnd != instr->GetSrc1() && opnd != instr->GetSrc2())
        {
            if(PHASE_OFF(Js::IndirCopyPropPhase, instr->m_func))
            {
                return opnd;
            }

            // Const-prop an indir opnd's constant index into its offset
            IR::Opnd *srcs[] = { instr->GetSrc1(), instr->GetSrc2(), instr->GetDst() };
            for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]); ++i)
            {
                const auto src = srcs[i];
                if(!src || !src->IsIndirOpnd())
                {
                    continue;
                }

                const auto indir = src->AsIndirOpnd();
                if ((int64)indir->GetOffset() + intConstantValue > INT32_MAX)
                {
                    continue;
                }
                if(opnd == indir->GetIndexOpnd())
                {
                    Assert(indir->GetScale() == 0);
                    GOPT_TRACE_OPND(opnd, _u("Constant prop indir index into offset (value: %d)\n"), intConstantValue);
                    this->CaptureByteCodeSymUses(instr);
                    indir->SetOffset(indir->GetOffset() + intConstantValue);
                    indir->SetIndexOpnd(nullptr);
                }
            }

            return opnd;
        }

        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return opnd;
        }

        IR::Opnd *constOpnd;

        if (opnd->IsVar())
        {
            IR::AddrOpnd *addrOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked((int)intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), addrOpnd->m_address, intConstantValue);
            constOpnd = addrOpnd;
        }
        else
        {
            // Note: Jit loop body generates some i32 operands...
            Assert(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32());
            IRType opndType;
            IntConstType constVal;
            if (opnd->IsUInt32())
            {
                // avoid sign extension
                constVal = (uint32)intConstantValue;
                opndType = TyUint32;
            }
            else
            {
                constVal = intConstantValue;
                opndType = TyInt32;
            }
            IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(constVal, opndType, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), intOpnd->GetImmediateValue(instr->m_func), intConstantValue);
            constOpnd = intOpnd;
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
        {
            instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
        }
#endif

        this->CaptureByteCodeSymUses(instr);
        opnd = instr->ReplaceSrc(opnd, constOpnd);

        switch (instr->m_opcode)
        {
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdFld:
        case Js::OpCode::LdFldForTypeOf:
        case Js::OpCode::LdRootFldForTypeOf:
        case Js::OpCode::LdFldForCallApplyTarget:
        case Js::OpCode::LdRootFld:
        case Js::OpCode::LdMethodFld:
        case Js::OpCode::LdRootMethodFld:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::ScopedLdMethodFld:
        case Js::OpCode::ScopedLdFld:
        case Js::OpCode::ScopedLdFldForTypeOf:
            instr->m_opcode = Js::OpCode::Ld_A;
        case Js::OpCode::Ld_A:
            {
                IR::Opnd * dst = instr->GetDst();
                if (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsSingleDef())
                {
                    dst->AsRegOpnd()->m_sym->SetIsIntConst((int)intConstantValue);
                }
                break;
            }
        case Js::OpCode::ArgOut_A:
        case Js::OpCode::ArgOut_A_Inline:
        case Js::OpCode::ArgOut_A_FixupForStackArgs:
        case Js::OpCode::ArgOut_A_InlineBuiltIn:

            if (instr->GetDst()->IsRegOpnd())
            {
                Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);
                instr->GetDst()->AsRegOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            else
            {
                instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            break;

        case Js::OpCode::TypeofElem:
            instr->m_opcode = Js::OpCode::Typeof;
            break;

        case Js::OpCode::StSlotChkUndecl:
            if (instr->GetSrc2() == opnd)
            {
                // Src2 here should refer to the same location as the Dst operand, which we need to keep live
                // due to the implicit read for ChkUndecl.
                instr->m_opcode = Js::OpCode::StSlot;
                instr->FreeSrc2();
                opnd = nullptr;
            }
            break;
        }
        return opnd;
    }
    else if (valueInfo->TryGetIntConstantValue(&int64ConstantValue, false))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func) || !PHASE_ON(Js::Int64ConstPropPhase, this->func))
        {
            return opnd;
        }

        Assert(this->func->GetJITFunctionBody()->IsWasmFunction());
        if (this->func->GetJITFunctionBody()->IsWasmFunction() && opnd->IsInt64())
        {
            IR::Int64ConstOpnd *intOpnd = IR::Int64ConstOpnd::New(int64ConstantValue, opnd->GetType(), instr->m_func);
            GOPT_TRACE_OPND(opnd, _u("Constant prop %lld (value:%lld)\n"), intOpnd->GetImmediateValue(instr->m_func), int64ConstantValue);
            this->CaptureByteCodeSymUses(instr);
            opnd = instr->ReplaceSrc(opnd, intOpnd);
        }
        return opnd;
    }

    Sym *opndSym = nullptr;
    if (opnd->IsRegOpnd())
    {
        IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
        opndSym = regOpnd->m_sym;
    }
    else if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
        opndSym = symOpnd->m_sym;
    }
    if (!opndSym)
    {
        return opnd;
    }

    if (PHASE_OFF(Js::CopyPropPhase, this->func))
    {
        this->SetSymStoreDirect(valueInfo, opndSym);
        return opnd;
    }

    StackSym *copySym = CurrentBlockData()->GetCopyPropSym(opndSym, val);
    if (copySym != nullptr)
    {
        Assert(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize());
        // Copy prop.
        return CopyPropReplaceOpnd(instr, opnd, copySym, parentIndirOpnd);
    }
    else
    {
        if (valueInfo->GetSymStore() && instr->m_opcode == Js::OpCode::Ld_A && instr->GetDst()->IsRegOpnd()
            && valueInfo->GetSymStore() == instr->GetDst()->AsRegOpnd()->m_sym)
        {
            // Avoid resetting symStore after fieldHoisting:
            //  t1 = LdFld field            <- set symStore to fieldHoistSym
            //   fieldHoistSym = Ld_A t1    <- we're looking at t1 now, but want to copy-prop fieldHoistSym forward
            return opnd;
        }
        this->SetSymStoreDirect(valueInfo, opndSym);
    }
    return opnd;
}